

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::iterate
          (TextureCubeArrayFilteringCase *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  deUint32 dVar3;
  TestLog *pTVar4;
  RenderContext *context;
  TestLog *log;
  pointer pFVar5;
  int y;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  uint uVar9;
  undefined4 extraout_var;
  RenderTarget *renderTarget;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  byte bVar11;
  char *description;
  uint uVar12;
  long lVar13;
  qpTestResult testResult;
  TestContext *pTVar14;
  pointer pFVar15;
  ulong uVar16;
  CubeFace face;
  long lVar17;
  undefined1 auVar18 [16];
  RandomViewport viewport;
  TextureCubeArrayView local_3b8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  float local_398;
  LodPrecision lodPrecision;
  vector<float,_std::allocator<float>_> texCoord;
  ScopedLogSection section;
  LookupPrecision lookupPrecision;
  Surface result;
  IVec4 coordBits;
  PixelFormat pixelFormat;
  TextureFormat texFmt;
  IVec4 colorBits;
  undefined1 local_288 [84];
  size_type local_234;
  bool bStack_22c;
  undefined3 uStack_22b;
  CompareMode CStack_228;
  int local_224;
  anon_union_16_3_1194ccdc_for_v local_220;
  bool local_210;
  undefined7 uStack_20f;
  LodMode local_208;
  undefined1 local_1f0 [32];
  int local_1d0;
  anon_union_16_3_1194ccdc_for_v local_1cc [21];
  TextureFormatInfo fmtInfo;
  long lVar10;
  
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*context->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar9 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar12 = (uVar9 >> 4 ^ uVar9) * 0x27d4eb2d;
  uVar9 = tcu::CommandLine::getBaseSeed
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,renderTarget,0x1c,0x1c,dVar8 ^ uVar9 ^ uVar12 ^ uVar12 >> 0xf);
  iVar7 = this->m_caseNdx;
  pFVar15 = (this->m_cases).
            super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar15[iVar7].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_288,"Test",(allocator<char> *)&coordBits);
  de::toString<int>((string *)&lookupPrecision,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &lookupPrecision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texCoord,"Test ",(allocator<char> *)&colorBits);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texCoord,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1f0,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&texCoord);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)&lookupPrecision);
  std::__cxx11::string::~string((string *)local_288);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_288,TEXTURETYPE_CUBE_ARRAY);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Render target too small",SSBOArrayLengthTests::init::arraysSized + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
               ,0x150);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1f0,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  local_224 = local_1d0;
  local_234 = local_1f0._16_8_;
  bStack_22c = (bool)local_1f0[0x18];
  uStack_22b = local_1f0._25_3_;
  CStack_228 = local_1f0._28_4_;
  local_288._68_8_ = local_1f0._0_8_;
  local_220._0_8_ = local_1cc[0]._0_8_;
  local_220._8_8_ = local_1cc[0]._8_8_;
  uStack_20f = (undefined7)((ulong)local_1cc[1]._0_8_ >> 8);
  local_210 = true;
  local_288._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
  local_288._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_288._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_288._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_288._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_288._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_288._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_288._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_288._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_208 = LODMODE_EXACT;
  pFVar15 = pFVar15 + iVar7;
  (**(code **)(lVar10 + 0xb8))(0x9009,pFVar15->texture->m_glTexture);
  (**(code **)(lVar10 + 0x1360))(0x9009,0x2801,this->m_minFilter);
  (**(code **)(lVar10 + 0x1360))(0x9009,0x2800,this->m_magFilter);
  (**(code **)(lVar10 + 0x1360))(0x9009,0x2802,this->m_wrapS);
  (**(code **)(lVar10 + 0x1360))(0x9009,0x2803,this->m_wrapT);
  (**(code **)(lVar10 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1f0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Coordinates: ");
  tcu::operator<<((ostream *)poVar1,&pFVar15->bottomLeft);
  std::operator<<((ostream *)poVar1," -> ");
  tcu::operator<<((ostream *)poVar1,&pFVar15->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1f0 + 8);
  uVar16 = 0;
  do {
    face = (CubeFace)uVar16;
    if (face == CUBEFACE_LAST) {
      iVar7 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar7;
      pFVar15 = (this->m_cases).
                super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pFVar5 = (this->m_cases).
               super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      return (IterateResult)(iVar7 < (int)((ulong)((long)pFVar15 - (long)pFVar5) >> 5));
    }
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCubeArray
              (&texCoord,face,&pFVar15->bottomLeft,&pFVar15->topRight,&pFVar15->layerRange);
    poVar2 = (ostringstream *)(local_1f0 + 8);
    local_1f0._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Face ");
    std::operator<<((ostream *)poVar2,&DAT_0081ecf4 + *(int *)(&DAT_0081ecf4 + uVar16 * 4));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    poVar2 = (ostringstream *)(local_1f0 + 8);
    local_1f0._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Texture coordinates:");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    lVar17 = (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
    lVar13 = 0xc;
    for (uVar16 = 0; (ulong)(lVar17 >> 2) >> 2 != uVar16; uVar16 = uVar16 + 1) {
      local_398 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar13 + -0xc);
      local_39c = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
      local_3a0 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar13 + -4);
      local_3a4 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar13);
      local_1f0._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,": (");
      std::ostream::operator<<(poVar1,local_398);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,local_39c);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,local_3a0);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,local_3a4);
      std::operator<<((ostream *)poVar1,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      lVar13 = lVar13 + 0x10;
    }
    gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_288);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                    ,0x173);
    y = viewport.y;
    iVar7 = viewport.x;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&result);
    glu::readPixels(context,iVar7,y,(PixelBufferAccess *)local_1f0);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                    ,0x176);
    dVar8 = this->m_minFilter;
    dVar3 = this->m_magFilter;
    iVar7 = (*context->_vptr_RenderContext[4])();
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_00,iVar7) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_00,iVar7) + 0x10);
    tcu::Vector<int,_4>::Vector(&coordBits,10);
    lookupPrecision.coordBits.m_data[0] = pixelFormat.redBits;
    lookupPrecision.coordBits.m_data[1] = pixelFormat.greenBits;
    lookupPrecision.coordBits.m_data[2] = pixelFormat.blueBits;
    lookupPrecision.uvwBits.m_data[0] = pixelFormat.alphaBits;
    tcu::operator-((tcu *)local_1f0,(Vector<int,_4> *)&lookupPrecision,
                   (dVar3 != 0x2600 || dVar8 != 0x2600) + 1);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3b8,0);
    tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_1f0,(Vector<int,_4> *)&local_3b8);
    lodPrecision.rule = RULE_OPENGL;
    lodPrecision.derivateBits = 0x16;
    lodPrecision.lodBits = 0x10;
    tcu::LookupPrecision::LookupPrecision(&lookupPrecision);
    poVar2 = (ostringstream *)(local_1f0 + 8);
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)&local_3b8,&colorBits);
    tcu::operator/((tcu *)local_1f0,(Vector<float,_4> *)&local_3b8,
                   (Vector<float,_4> *)(local_288 + 0x24));
    lookupPrecision.colorThreshold.m_data[0] = (float)local_1f0._0_4_;
    lookupPrecision.colorThreshold.m_data[1] = (float)local_1f0._4_4_;
    tcu::Vector<int,_4>::toWidth<3>((Vector<int,_4> *)local_1f0);
    lookupPrecision.coordBits.m_data[2] = local_1f0._8_4_;
    lookupPrecision.coordBits.m_data[0] = local_1f0._0_4_;
    lookupPrecision.coordBits.m_data[1] = local_1f0._4_4_;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_1f0,6);
    lookupPrecision.uvwBits.m_data[2] = local_1f0._8_4_;
    lookupPrecision.uvwBits.m_data[0] = (int)local_1f0._0_8_;
    lookupPrecision.uvwBits.m_data[1] = SUB84(local_1f0._0_8_,4);
    auVar18._0_4_ = -(uint)(0 < pixelFormat.redBits);
    auVar18._4_4_ = -(uint)(0 < pixelFormat.greenBits);
    auVar18._8_4_ = -(uint)(0 < pixelFormat.blueBits);
    auVar18._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
    uVar9 = movmskps(lookupPrecision.uvwBits.m_data[0],auVar18);
    bVar11 = (byte)uVar9;
    lookupPrecision.colorMask.m_data =
         (bool  [4])
         (uVar9 & 1 | (uint)((bVar11 & 2) >> 1) << 8 | (uint)((bVar11 & 4) >> 2) << 0x10 |
         (uint)(bVar11 >> 3) << 0x18);
    pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&result);
    local_3b8.m_numLevels = (pFVar15->texture->m_refTexture).m_view.m_numLevels;
    local_3b8.m_levels = (pFVar15->texture->m_refTexture).m_view.m_levels;
    bVar6 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar14,(ConstPixelBufferAccess *)local_1f0,&local_3b8,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_288,
                       &lookupPrecision,&coordBits,&lodPrecision,&pixelFormat);
    if (!bVar6) {
      lodPrecision.lodBits = 4;
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_1f0,4);
      lookupPrecision.uvwBits.m_data[2] = local_1f0._8_4_;
      lookupPrecision.uvwBits.m_data[0] = (int)local_1f0._0_8_;
      lookupPrecision.uvwBits.m_data[1] = SUB84(local_1f0._0_8_,4);
      local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,
                      "Warning: Verification against high precision requirements failed, trying with lower requirements."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&result);
      local_3b8.m_numLevels = (pFVar15->texture->m_refTexture).m_view.m_numLevels;
      local_3b8.m_levels = (pFVar15->texture->m_refTexture).m_view.m_levels;
      bVar6 = glu::TextureTestUtil::verifyTextureResult
                        (pTVar14,(ConstPixelBufferAccess *)local_1f0,&local_3b8,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_288,
                         &lookupPrecision,&coordBits,&lodPrecision,&pixelFormat);
      poVar2 = (ostringstream *)(local_1f0 + 8);
      if (bVar6) {
        pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        description = "Low-quality filtering result";
        if (pTVar14->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0049edbd;
      }
      else {
        local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "ERROR: Verification against low precision requirements failed, failing test case."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar14,testResult,description);
    }
LAB_0049edbd:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    tcu::Surface::~Surface(&result);
    uVar16 = (ulong)(face + CUBEFACE_POSITIVE_X);
  } while( true );
}

Assistant:

TextureCubeArrayFilteringCase::IterateResult TextureCubeArrayFilteringCase::iterate (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const deUint32					randomSeed		= deStringHash(getName()) ^ deInt32Hash(m_caseNdx) ^ m_testCtx.getCommandLine().getBaseSeed();
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, randomSeed);
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams		(TEXTURETYPE_CUBE_ARRAY);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Render target too small", "", __FILE__, __LINE__);

	// Params for reference computation.
	refParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;
	refParams.lodMode					= LODMODE_EXACT;

	gl.bindTexture	(GL_TEXTURE_CUBE_MAP_ARRAY, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCubeArray(texCoord, face, curCase.bottomLeft, curCase.topRight, curCase.layerRange);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		log << TestLog::Message << "Texture coordinates:" << TestLog::EndMessage;

		logCubeArrayTexCoords(log, texCoord);

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		coordBits		= tcu::IVec4(10);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= coordBits.toWidth<3>();
			lookupPrecision.uvwBits			= tcu::IVec3(6);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}